

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

char * __thiscall
testing::internal::UntypedFunctionMockerBase::Name(UntypedFunctionMockerBase *this)

{
  char *pcVar1;
  allocator<char> local_41;
  string local_40;
  GTestMutexLock local_20;
  MutexLock l;
  char *name;
  UntypedFunctionMockerBase *this_local;
  
  GTestMutexLock::GTestMutexLock(&local_20,(MutexBase *)g_gmock_mutex);
  pcVar1 = this->name_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Name() must not be called before SetOwnerAndName() has been called.",&local_41);
  Assert(pcVar1 != (char *)0x0,
         "/workspace/llm4binary/github/license_all_cmakelists_25/jmossberg[P]tenniskatacpp/google/googlemock/src/gmock-spec-builders.cc"
         ,0x147,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  l.mutex_ = (MutexBase *)this->name_;
  GTestMutexLock::~GTestMutexLock(&local_20);
  return (char *)l.mutex_;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  const char* name;
  {
    // We protect name_ under g_gmock_mutex in case this mock
    // function is called from two threads concurrently.
    MutexLock l(&g_gmock_mutex);
    Assert(name_ != NULL, __FILE__, __LINE__,
           "Name() must not be called before SetOwnerAndName() has "
           "been called.");
    name = name_;
  }
  return name;
}